

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O0

void Bmc_LoadTest(Gia_Man_t *pGia,int fLoadCnf,int fVerbose)

{
  Gia_Obj_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  abctime aVar5;
  bool bVar6;
  abctime clk;
  int local_38;
  int Lit;
  int status;
  int i;
  Gia_Obj_t *pObj;
  Bmc_Load_t *p;
  int local_18;
  int nConfLimit;
  int fVerbose_local;
  int fLoadCnf_local;
  Gia_Man_t *pGia_local;
  
  p._4_4_ = 0;
  local_18 = fVerbose;
  nConfLimit = fLoadCnf;
  _fVerbose_local = pGia;
  aVar4 = Abc_Clock();
  pObj = (Gia_Obj_t *)Bmc_LoadStart(_fVerbose_local);
  if (nConfLimit != 0) {
    ((Bmc_Load_t *)pObj)->pSat->pCnfMan = pObj;
    ((Bmc_Load_t *)pObj)->pSat->pCnfFunc = Bmc_LoadAddCnf;
  }
  Lit = 0;
  while( true ) {
    iVar2 = Lit;
    iVar1 = Gia_ManPoNum(_fVerbose_local);
    bVar6 = false;
    if (iVar2 < iVar1) {
      _status = Gia_ManCo(_fVerbose_local,Lit);
      bVar6 = _status != (Gia_Obj_t *)0x0;
    }
    p_00 = pObj;
    if (!bVar6) break;
    if (nConfLimit == 0) {
      iVar2 = Gia_ObjFaninId0p(_fVerbose_local,_status);
      iVar2 = Bmc_LoadAddCnf_rec((Bmc_Load_t *)p_00,iVar2);
      iVar1 = Gia_ObjFaninC0(_status);
      clk._4_4_ = Abc_Var2Lit(iVar2,iVar1);
    }
    else {
      iVar2 = Gia_ObjFaninId0p(_fVerbose_local,_status);
      iVar2 = Bmc_LoadGetSatVar((Bmc_Load_t *)p_00,iVar2);
      iVar1 = Gia_ObjFaninC0(_status);
      clk._4_4_ = Abc_Var2Lit(iVar2,iVar1);
    }
    if (local_18 != 0) {
      printf("Frame%4d :  ",(ulong)(uint)Lit);
      uVar3 = Vec_IntSize(*(Vec_Int_t **)(pObj + 2));
      printf("Vars = %6d  ",(ulong)uVar3);
      uVar3 = sat_solver_nclauses(*(sat_solver **)&pObj[1].field_0x4);
      printf("Clas = %6d  ",(ulong)uVar3);
    }
    local_38 = sat_solver_solve(*(sat_solver **)&pObj[1].field_0x4,(lit *)((long)&clk + 4),&local_38
                                ,(long)p._4_4_,0,0,0);
    if (local_18 != 0) {
      uVar3 = sat_solver_nconflicts(*(sat_solver **)&pObj[1].field_0x4);
      printf("Conf = %6d  ",(ulong)uVar3);
      if (local_38 == -1) {
        printf("UNSAT  ");
      }
      else if (local_38 == 1) {
        printf("SAT    ");
      }
      else {
        printf("UNDEC  ");
      }
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
    Lit = Lit + 1;
  }
  printf("Callbacks = %d.  Loadings = %d.\n",(ulong)pObj[2].Value,(ulong)*(uint *)(pObj + 3));
  Bmc_LoadStop((Bmc_Load_t *)pObj);
  return;
}

Assistant:

void Bmc_LoadTest( Gia_Man_t * pGia, int fLoadCnf, int fVerbose )
{
    int nConfLimit = 0;
    Bmc_Load_t * p;
    Gia_Obj_t * pObj;
    int i, status, Lit;
    abctime clk = Abc_Clock();
    // create the loading manager
    p = Bmc_LoadStart( pGia );
    // add callback for CNF loading
    if ( fLoadCnf )
    {
        p->pSat->pCnfMan  = p;
        p->pSat->pCnfFunc = Bmc_LoadAddCnf;
    }
    // solve SAT problem for each PO
    Gia_ManForEachPo( pGia, pObj, i )
    {
        if ( fLoadCnf )
            Lit = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(pGia, pObj)), Gia_ObjFaninC0(pObj) );
        else
            Lit = Abc_Var2Lit( Bmc_LoadAddCnf_rec(p, Gia_ObjFaninId0p(pGia, pObj)), Gia_ObjFaninC0(pObj) );
        if ( fVerbose )
        {
            printf( "Frame%4d :  ", i );
            printf( "Vars = %6d  ", Vec_IntSize(p->vSat2Id) );
            printf( "Clas = %6d  ", sat_solver_nclauses(p->pSat) );
        }
        status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "Conf = %6d  ", sat_solver_nconflicts(p->pSat) );
            if ( status == l_False )
                printf( "UNSAT  " );
            else if ( status == l_True )
                printf( "SAT    " );
            else // if ( status == l_Undec )
                printf( "UNDEC  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
    }
    printf( "Callbacks = %d.  Loadings = %d.\n", p->nCallBacks1, p->nCallBacks2 );
    Bmc_LoadStop( p );
}